

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void __thiscall Render::parseTileset(Render *this,SDL_Surface *_tileset)

{
  SDL_Surface *pSVar1;
  long lVar2;
  undefined8 uVar3;
  SDL_Surface **ppSVar4;
  SDL_Surface **ppSVar5;
  int i;
  int iVar6;
  long lVar7;
  SDL_Rect cut;
  
  ppSVar4 = this->blockBitmap;
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
    ppSVar5 = ppSVar4;
    for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x10) {
      cut.y = (int)lVar7;
      cut.w = 0x18;
      cut.h = 0x10;
      cut.x = (int)lVar2 * 0x18;
      pSVar1 = (SDL_Surface *)
               SDL_CreateRGBSurface(0,0x18,0x10,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
      *ppSVar5 = pSVar1;
      SDL_UpperBlit(_tileset,&cut,pSVar1,0);
      ppSVar5 = ppSVar5 + 1;
    }
    ppSVar4 = ppSVar4 + 8;
  }
  ppSVar4 = this->ballBitmap;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
      cut.y = (uint)lVar7 | 0x90;
      cut.w = 8;
      cut.h = 8;
      cut.x = (int)lVar2 * 8;
      uVar3 = SDL_CreateRGBSurface(0,8,8,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
      *(undefined8 *)((long)ppSVar4 + lVar7) = uVar3;
      SDL_UpperBlit(_tileset,&cut,uVar3,0);
    }
    ppSVar4 = ppSVar4 + 2;
  }
  ppSVar4 = this->paletteBitmap;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
      cut.y = (uint)lVar7 | 0x90;
      cut.w = 0x30;
      cut.h = 8;
      cut.x = (int)lVar2 * 0x30 + 0x18;
      uVar3 = SDL_CreateRGBSurface(0,0x30,8,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
      *(undefined8 *)((long)ppSVar4 + lVar7) = uVar3;
      SDL_UpperBlit(_tileset,&cut,uVar3,0);
    }
    ppSVar4 = ppSVar4 + 2;
  }
  ppSVar4 = this->paletteBitmap + 4;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
      cut.y = (uint)lVar7 | 0x80;
      cut.w = 0x60;
      cut.h = 8;
      cut.x = (int)lVar2 * 0x60;
      uVar3 = SDL_CreateRGBSurface(0,0x60,8,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
      *(undefined8 *)((long)ppSVar4 + lVar7) = uVar3;
      SDL_UpperBlit(_tileset,&cut,uVar3,0);
    }
    ppSVar4 = ppSVar4 + 2;
  }
  iVar6 = 0x78;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    cut.y = 0x90;
    cut.w = 0x10;
    cut.h = 0x10;
    cut.x = iVar6;
    pSVar1 = (SDL_Surface *)
             SDL_CreateRGBSurface(0,0x10,0x10,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
    this->iconBitmap[lVar2] = pSVar1;
    SDL_UpperBlit(_tileset,&cut,pSVar1,0);
    iVar6 = iVar6 + 0x10;
  }
  return;
}

Assistant:

void Render::parseTileset(SDL_Surface *_tileset){
    // Get blocks
    for(int i=0; i<10; i++){
        for(int j=0; j<8; j++){
            SDL_Rect cut;
            cut.x = i*BLOCK_W;
            cut.y = j*BLOCK_H;
            cut.w = BLOCK_W;
            cut.h = BLOCK_H;
            blockBitmap[i*8 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, blockBitmap[i*8 + j], nullptr);
        }
    }

    // Get balls
    for(int i=0; i<3; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*BALL_W;
            cut.y = j*BALL_H + 144;
            cut.w = BALL_W;
            cut.h = BALL_H;
            ballBitmap[i*2 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, ballBitmap[i*2 + j], nullptr);
        }
    }

    // Get small palettes
    for(int i=0; i<2; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*PALETTE_SW + 24;
            cut.y = j*PALETTE_SH + 144;
            cut.w = PALETTE_SW;
            cut.h = PALETTE_SH;
            paletteBitmap[i*2 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, paletteBitmap[i*2 + j], nullptr);
        }
    }

    // Get big palettes
    for(int i=0; i<2; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*PALETTE_BW;
            cut.y = j*PALETTE_BH + 128;
            cut.w = PALETTE_BW;
            cut.h = PALETTE_BH;
            paletteBitmap[i*2 + j + 4] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, paletteBitmap[i*2 + j + 4], nullptr);
        }
    }

    // Get icons
    for(int i=0; i<8; i++){
        SDL_Rect cut;
        cut.x = i*ICON_W + 120;
        cut.y = 144;
        cut.w = ICON_W;
        cut.h = ICON_H;
        iconBitmap[i] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
        SDL_BlitSurface(_tileset, &cut, iconBitmap[i], nullptr);
    }
}